

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double __thiscall NoiseShape::getOutput(NoiseShape *this)

{
  int local_1c;
  double dStack_18;
  int i;
  double err;
  NoiseShape *this_local;
  
  dStack_18 = 0.0;
  for (local_1c = 0; local_1c < this->mTaps; local_1c = local_1c + 1) {
    dStack_18 = this->mCoeff[local_1c] * this->mErr[(this->mErrPtr + local_1c) % this->mTaps] +
                dStack_18;
  }
  return dStack_18;
}

Assistant:

double getOutput() {
		double err = .0;
		for (int i=0; i < mTaps; ++i) {
			err += mCoeff[i] * mErr[(mErrPtr + i) % mTaps];
		}
		return err;
	}